

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

void Sbd_ManStop(Sbd_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  void *pvVar2;
  int *piVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  long lVar9;
  
  pVVar1 = p->vTfos;
  iVar6 = pVVar1->nCap;
  pVVar7 = pVVar1->pArray;
  if (iVar6 < 1) {
    if (pVVar7 != (Vec_Int_t *)0x0) goto LAB_0053faaa;
  }
  else {
    lVar9 = 8;
    lVar8 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar7->nCap + lVar9);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar7 = pVVar1->pArray;
        *(undefined8 *)((long)&pVVar7->nCap + lVar9) = 0;
        iVar6 = pVVar1->nCap;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < iVar6);
LAB_0053faaa:
    free(pVVar7);
  }
  free(pVVar1);
  pVVar7 = p->vLutLevs;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vLutCuts;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vMirrors;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  lVar8 = 7;
  do {
    pVVar4 = p->vSims[lVar8 + -7];
    pwVar5 = pVVar4->pArray;
    if (pwVar5 != (word *)0x0) {
      free(pwVar5);
    }
    free(pVVar4);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xb);
  pVVar7 = p->vCover;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vLits;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vLits2;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vRoots;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vWinObjs;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vObj2Var;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vDivSet;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vDivVars;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vDivValues;
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar1 = p->vDivLevels;
  iVar6 = pVVar1->nCap;
  pVVar7 = pVVar1->pArray;
  if (iVar6 < 1) {
    if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_0053fc80;
  }
  else {
    lVar9 = 8;
    lVar8 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar7->nCap + lVar9);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar7 = pVVar1->pArray;
        *(undefined8 *)((long)&pVVar7->nCap + lVar9) = 0;
        iVar6 = pVVar1->nCap;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < iVar6);
  }
  free(pVVar7);
LAB_0053fc80:
  free(pVVar1);
  pVVar7 = p->vCounts[0];
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar7 = p->vCounts[1];
  piVar3 = pVVar7->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar7);
  pVVar4 = p->vMatrix;
  pwVar5 = pVVar4->pArray;
  if (pwVar5 != (word *)0x0) {
    free(pwVar5);
  }
  free(pVVar4);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  p->pSat = (sat_solver *)0x0;
  if (p->pSto != (Sbd_Sto_t *)0x0) {
    Sbd_StoFree(p->pSto);
  }
  if (p->pSrv != (Sbd_Srv_t *)0x0) {
    Sbd_ManCutServerStop(p->pSrv);
  }
  free(p);
  return;
}

Assistant:

void Sbd_ManStop( Sbd_Man_t * p )
{
    int i;
    Vec_WecFree( p->vTfos );
    Vec_IntFree( p->vLutLevs );
    Vec_IntFree( p->vLutCuts );
    Vec_IntFree( p->vMirrors );
    for ( i = 0; i < 4; i++ )
        Vec_WrdFree( p->vSims[i] );
    Vec_IntFree( p->vCover );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vLits2 );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vWinObjs );
    Vec_IntFree( p->vObj2Var );
    Vec_IntFree( p->vDivSet );
    Vec_IntFree( p->vDivVars );
    Vec_IntFree( p->vDivValues );
    Vec_WecFree( p->vDivLevels );
    Vec_IntFree( p->vCounts[0] );
    Vec_IntFree( p->vCounts[1] );
    Vec_WrdFree( p->vMatrix );
    sat_solver_delete_p( &p->pSat );
    if ( p->pSto ) Sbd_StoFree( p->pSto );
    if ( p->pSrv ) Sbd_ManCutServerStop( p->pSrv );
    ABC_FREE( p );
}